

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O3

bool writeError(path *fname,FILE **fileToClose)

{
  int iVar1;
  undefined8 *in_RDX;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,fname,(long)fileToClose + (long)fname);
  Error("Write error (disk full?)",(char *)local_38[0],IF_FIRST);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar1 = fclose((FILE *)*in_RDX);
  return SUB41(iVar1,0);
}

Assistant:

static bool writeError(const std::filesystem::path & fname, FILE* & fileToClose) {
	Error("Write error (disk full?)", fname.string().c_str(), IF_FIRST);
	fclose(fileToClose);
	return false;
}